

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sovr.h
# Opt level: O2

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* sovr(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
       *__return_storage_ptr__,int c,int r,
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      *mcurrent,vector<float,_std::allocator<float>_> *x,int m)

{
  int iVar1;
  pointer pvVar2;
  pointer pfVar3;
  pointer pvVar4;
  ostream *poVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  temp;
  ofstream file_stream;
  byte abStack_210 [480];
  
  makeMatrix(&temp,r,c);
  uVar8 = 0;
  if (0 < r) {
    uVar8 = (ulong)(uint)r;
  }
  uVar14 = r + 1;
  uVar7 = (ulong)(uint)r;
  for (iVar6 = 1; iVar6 < c + -1; iVar6 = iVar6 + uVar14) {
    for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
      pvVar2 = (mcurrent->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar3 = (x->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = (long)iVar6;
      uVar13 = uVar7;
      while (bVar16 = uVar13 != 0, uVar13 = uVar13 - 1, bVar16) {
        iVar1 = *(int *)(*(long *)&pvVar2[uVar11].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + lVar10 * 4);
        if (iVar1 == -1) {
          fVar17 = -pfVar3[iVar6 / r];
        }
        else {
          fVar17 = 0.0;
          if (iVar1 == 1) {
            fVar17 = pfVar3[iVar6 / r];
          }
        }
        temp.
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar11].
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
        [lVar10] = fVar17;
        lVar10 = lVar10 + 1;
      }
    }
  }
  for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
    lVar10 = (long)(int)uVar14 * 4;
    for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
      lVar15 = lVar10;
      for (lVar12 = 1; lVar12 < m; lVar12 = lVar12 + 1) {
        pfVar3 = temp.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11].
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        pfVar3[uVar13] = *(float *)((long)pfVar3 + lVar15) + pfVar3[uVar13];
        lVar15 = lVar15 + (long)(int)uVar14 * 4;
      }
      lVar10 = lVar10 + 4;
    }
  }
  makeMatrix(__return_storage_ptr__,r,r);
  for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
    pvVar4 = (__return_storage_ptr__->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
      *(float *)(*(long *)&pvVar4[uVar11].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data + uVar13 * 4) =
           temp.
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar11].
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar13 + 1];
    }
  }
  std::operator<<((ostream *)&std::cout,"\nComputed currents fit the law of nodes\n");
  for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
    pvVar4 = (__return_storage_ptr__->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
      lVar10 = *(long *)&pvVar4[uVar11].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data;
      if (*(float *)(lVar10 + uVar13 * 4) <= 0.0) {
        *(undefined4 *)(lVar10 + uVar13 * 4) = 0;
      }
    }
  }
  std::ofstream::ofstream(&file_stream,"current.dat",_S_out);
  std::operator<<((ostream *)&file_stream,
                  "The current matrix stores the currents between nodes in the circuit.\n");
  std::operator<<((ostream *)&file_stream,
                  "Entry with (row, column) indexes (A, B) identifies a current flowing from node A to node B, while the corresponding (B, A) entry is empty.\n"
                 );
  std::operator<<((ostream *)&file_stream,"Current matrix: \n");
  uVar14 = r - 1;
  uVar7 = 0;
  uVar11 = 0;
  if (0 < (int)uVar14) {
    uVar11 = (ulong)uVar14;
  }
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    for (uVar13 = 0;
        lVar10 = *(long *)&(__return_storage_ptr__->
                           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar7].
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data, uVar11 != uVar13; uVar13 = uVar13 + 1) {
      poVar5 = (ostream *)std::ostream::operator<<(&file_stream,*(float *)(lVar10 + uVar13 * 4));
      std::operator<<(poVar5,"\t");
    }
    poVar5 = (ostream *)
             std::ostream::operator<<(&file_stream,*(float *)(lVar10 + (long)(int)uVar14 * 4));
    std::operator<<(poVar5,"\n");
  }
  pcVar9 = "Error in writing file current.data\n";
  if ((abStack_210[*(long *)(_file_stream + -0x18)] & 5) == 0) {
    pcVar9 = "File current.dat has been written\n";
  }
  std::operator<<((ostream *)&std::cout,pcVar9);
  std::ofstream::~ofstream(&file_stream);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&temp);
  return __return_storage_ptr__;
}

Assistant:

auto sovr(int c, int r, std::vector<std::vector<int> > &mcurrent, std::vector<float> &x, int m)
{
    int i, j, k, n;
    using std::vector;
    auto temp = makeMatrix(r, c);
    float sum;

    // multiply the  temp matrix by the values of the mesh currents in each individual mesh
    for (k = 1; k < c-1; k = k + r + 1)
    {
        for ( i = 0; i < r; i++)
        {
            for (j = 0; j < r; j++)
            {
                if(mcurrent[i][j+k] == 1)
                {
                    temp[i][j+k] = x[k/r];
                } else if (mcurrent[i][j+k] == -1)
                {
                    temp[i][j+k] = -x[k/r];
                } else
                {
                    temp[i][j+k] = 0;
                }

            }
        }
    }

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r + 1 ; j++)
        {
            for (k = 1; k < m; k++)
            {
                temp[i][j] +=  + temp[i][j+k*(r+1)];
            }
        }
    }

    auto current = makeMatrix(r, r);

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r; j++)
        {
            current[i][j] = temp[i][j+1];
        }
    }

    //Check that the results are correct by applying the law of nodes (and angles)
    // note that the law of the nodes is verified if the sum of the terms on each row is 0 (4.d.p)
    k = 0;
    for (i = 0; i < r; i++)
    {
        sum = 0;
        for (j = 0; j < r; j++)
        {
            sum += current[i][j];
        }
        if (sum >= 0.0001 && sum <= -0.0001)
        {
            std::cout << "\n There was an error while calculating currents\n";
            k = 1;
            break;
        }
    }
    if(k==0)
    {
        std::cout << "\nComputed currents fit the law of nodes\n";
    }

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r; j++)
        {
            if (current[i][j] <= 0)
            {
                current[i][j] = 0;
            }
        }
    }

    std::ofstream file_stream("current.dat");
    file_stream << "The current matrix stores the currents between nodes in the circuit.\n";
    file_stream << "Entry with (row, column) indexes (A, B) identifies a current flowing from node A to node B, while the corresponding (B, A) entry is empty.\n";
    file_stream << "Current matrix: \n";

    for (i = 0; i < r; i++)
    {
        for (j = 0; j < r - 1; j++)
        {
            file_stream << current[i][j] << "\t";
        }
        file_stream << current[i][r-1] << "\n";
    }

    if (!file_stream)
    {
        std::cout << "Error in writing file current.data\n";
    } else {
        std::cout << "File current.dat has been written\n";
    }

    return current;
}